

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

long __thiscall Alice::ObliviousComparison(Alice *this,string *op,long arg1,long arg2)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  Message MVar4;
  undefined1 auStack_48 [8];
  Message msg_for_Bob;
  
  auStack_48 = (undefined1  [8])0x0;
  msg_for_Bob.scalar1 = 0;
  msg_for_Bob.scalar2 = (long)this;
  MVar4 = Server::Receive(this->srv);
  bVar1 = std::operator==(op,">=");
  if (bVar1) {
    bVar1 = MVar4.scalar2 + arg2 <= MVar4.scalar1 + arg1;
  }
  else {
    std::operator==(op,"==");
    bVar1 = MVar4.scalar1 + arg1 == MVar4.scalar2 + arg2;
  }
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar2 = rand();
  auStack_48 = (undefined1  [8])(long)(iVar2 % 100);
  Server::Send(*(Server **)(msg_for_Bob.scalar2 + 0x118),(Message *)auStack_48);
  return (ulong)bVar1 - (long)auStack_48;
}

Assistant:

long Alice::ObliviousComparison(std::string op, long arg1, long arg2)
{
    long beta;
    Message msg_for_Bob, msg_from_Bob;
    msg_from_Bob = srv->Receive();
    if(op == ">=")
    {
        beta = ((arg1 + msg_from_Bob.scalar1) >= (arg2 + msg_from_Bob.scalar2) ? 1 : 0);
        srand(time(NULL));		
		msg_for_Bob.scalar1 = rand()%100;
        srv->Send(msg_for_Bob);
        beta = beta - msg_for_Bob.scalar1;                
    }
    else if(op == "==")
    {
        beta = ((arg1 + msg_from_Bob.scalar1) == (arg2 + msg_from_Bob.scalar2) ? 1 : 0);
        srand(time(NULL));		
		msg_for_Bob.scalar1 = rand()%100;
        srv->Send(msg_for_Bob);
        beta = beta - msg_for_Bob.scalar1; 
    }
    return beta;
}